

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.cpp
# Opt level: O3

unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> __thiscall
duckdb::BlockHandle::UnloadAndTakeBlock(BlockHandle *this,BlockLock *lock)

{
  undefined1 uVar1;
  undefined8 uVar2;
  long *plVar3;
  type pFVar4;
  BlockHandle *pBVar5;
  
  pBVar5 = this;
  if (*(char *)&lock[4]._M_device != '\0') {
    if ((0x400000000000005f < *(long *)&lock[4]._M_owns) && (*(char *)&lock[7]._M_device == '\0')) {
      uVar2 = *(undefined8 *)&lock[4]._M_owns;
      plVar3 = *(long **)((long)&((lock[1]._M_device)->super___mutex_base)._M_mutex + 8);
      uVar1 = *(undefined1 *)&lock[5]._M_device;
      pFVar4 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
               operator*((unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                          *)&lock[5]._M_owns);
      (**(code **)(*plVar3 + 0x120))(plVar3,uVar1,uVar2,pFVar4);
    }
    BufferPool::MemoryUsage::UpdateUsedMemory
              ((MemoryUsage *)((long)&lock[9]._M_device[3].super___mutex_base._M_mutex + 8),
               *(MemoryTag *)&lock[8]._M_device,-*(long *)&lock[8]._M_owns);
    *(undefined8 *)&lock[8]._M_owns = 0;
    LOCK();
    *(undefined1 *)&lock[4]._M_device = 0;
    UNLOCK();
    (this->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
    super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)&lock[5]._M_owns;
    pBVar5 = (BlockHandle *)&lock[5]._M_owns;
  }
  (pBVar5->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  return (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)
         (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)this;
}

Assistant:

unique_ptr<FileBuffer> BlockHandle::UnloadAndTakeBlock(BlockLock &lock) {
	VerifyMutex(lock);

	if (state == BlockState::BLOCK_UNLOADED) {
		// already unloaded: nothing to do
		return nullptr;
	}
	D_ASSERT(!unswizzled);
	D_ASSERT(CanUnload());

	if (block_id >= MAXIMUM_BLOCK && MustWriteToTemporaryFile()) {
		// temporary block that cannot be destroyed upon evict/unpin: write to temporary file
		block_manager.buffer_manager.WriteTemporaryBuffer(tag, block_id, *buffer);
	}
	memory_charge.Resize(0);
	state = BlockState::BLOCK_UNLOADED;
	return std::move(buffer);
}